

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O1

void Msat_MmStepEntryRecycle(Msat_MmStep_t *p,char *pEntry,int nBytes)

{
  Msat_MmFixed_t *pMVar1;
  
  if (nBytes != 0) {
    if (p->nMapSize < nBytes) {
      if (pEntry != (char *)0x0) {
        free(pEntry);
        return;
      }
    }
    else {
      pMVar1 = p->pMap[nBytes];
      pMVar1->nEntriesUsed = pMVar1->nEntriesUsed + -1;
      *(char **)pEntry = pMVar1->pEntriesFree;
      pMVar1->pEntriesFree = pEntry;
    }
  }
  return;
}

Assistant:

void Msat_MmStepEntryRecycle( Msat_MmStep_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
        ABC_FREE( pEntry );
        return;
    }
    Msat_MmFixedEntryRecycle( p->pMap[nBytes], pEntry );
}